

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O2

void __thiscall enact::AstSerialise::visitSwitchExpr_abi_cxx11_(AstSerialise *this)

{
  SwitchExpr *in_RDX;
  long in_RSI;
  
  visitSwitchExpr_abi_cxx11_((string *)this,(AstSerialise *)(in_RSI + -8),in_RDX);
  return;
}

Assistant:

std::string AstSerialise::visitSwitchExpr(SwitchExpr& expr) {
        std::stringstream s;

        s << m_ident << "(Expr::Switch " << visitExpr(*expr.value) << " (\n";
        m_ident += "    ";

        for (auto &case_ : expr.cases) {
            s << m_ident << "(" << visitPattern(*case_.pattern) << " " <<
                    visitExpr(*case_.predicate) << " (\n";
            m_ident += "    ";

            s << visitExpr(*case_.body);

            m_ident.erase(0, 4);
            s << m_ident << ")\n";
        }

        m_ident.erase(0, 4);
        s << m_ident << ")";

        return s.str();
    }